

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall aiString::aiString(aiString *this,string *pString)

{
  ai_uint32 aVar1;
  void *__src;
  string *pString_local;
  aiString *this_local;
  
  aVar1 = std::__cxx11::string::length();
  this->length = aVar1;
  if (this->length < 0x400) {
    aVar1 = this->length;
  }
  else {
    aVar1 = 0x3ff;
  }
  this->length = aVar1;
  __src = (void *)std::__cxx11::string::c_str();
  memcpy(this->data,__src,(ulong)this->length);
  this->data[this->length] = '\0';
  return;
}

Assistant:

explicit aiString(const std::string& pString) :
        length( (ai_uint32) pString.length())
    {
        length = length>=MAXLEN?MAXLEN-1:length;
        memcpy( data, pString.c_str(), length);
        data[length] = '\0';
    }